

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilPath.c
# Opt level: O3

double Abc_GraphCountPaths(Vec_Wec_t *vNodes,Vec_Int_t *vEdges)

{
  Vec_Int_t *pVVar1;
  undefined1 auVar2 [16];
  int iVar3;
  double **pCache;
  double *pdVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar12 [16];
  int pBuffer [1000];
  int local_fd8 [1002];
  long lVar11;
  
  memset(local_fd8,0,4000);
  lVar7 = (long)vNodes->nSize;
  pCache = (double **)malloc(lVar7 * 8);
  if (0 < lVar7) {
    pVVar1 = vNodes->pArray;
    lVar6 = 0;
    do {
      iVar3 = pVVar1[lVar6].nSize;
      lVar5 = (long)iVar3;
      pdVar4 = (double *)malloc(lVar5 * 8);
      auVar2 = _DAT_00912220;
      pCache[lVar6] = pdVar4;
      if (0 < lVar5) {
        lVar5 = lVar5 + -1;
        auVar9._8_4_ = (int)lVar5;
        auVar9._0_8_ = lVar5;
        auVar9._12_4_ = (int)((ulong)lVar5 >> 0x20);
        auVar9 = auVar9 ^ auVar2;
        lVar5 = 0;
        auVar10 = _DAT_00912210;
        do {
          auVar12 = auVar10 ^ auVar2;
          if ((bool)(~(auVar9._4_4_ < auVar12._4_4_ ||
                      auVar9._0_4_ < auVar12._0_4_ && auVar12._4_4_ == auVar9._4_4_) & 1)) {
            *(undefined8 *)((long)pdVar4 + lVar5) = 0xbff0000000000000;
          }
          if (auVar12._12_4_ <= auVar9._12_4_ &&
              (auVar12._8_4_ <= auVar9._8_4_ || auVar12._12_4_ != auVar9._12_4_)) {
            *(undefined8 *)((long)pdVar4 + lVar5 + 8) = 0xbff0000000000000;
          }
          lVar11 = auVar10._8_8_;
          auVar10._0_8_ = auVar10._0_8_ + 2;
          auVar10._8_8_ = lVar11 + 2;
          lVar5 = lVar5 + 0x10;
        } while ((ulong)(iVar3 + 1U >> 1) << 4 != lVar5);
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != lVar7);
  }
  dVar8 = Abc_GraphCountPaths_rec(0,0,vNodes,pCache,local_fd8,vEdges);
  iVar3 = vNodes->nSize;
  if (iVar3 < 1) {
    if (pCache == (double **)0x0) {
      return dVar8;
    }
  }
  else {
    lVar7 = 0;
    do {
      if (pCache[lVar7] != (double *)0x0) {
        free(pCache[lVar7]);
        pCache[lVar7] = (double *)0x0;
        iVar3 = vNodes->nSize;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < iVar3);
  }
  free(pCache);
  return dVar8;
}

Assistant:

double Abc_GraphCountPaths( Vec_Wec_t * vNodes, Vec_Int_t * vEdges )
{
    int i, k, pBuffer[1000] = {0};
    double ** pCache = ABC_ALLOC( double *, Vec_WecSize(vNodes) );
    Vec_Int_t * vLevel;   double Value;
    Vec_WecForEachLevel( vNodes, vLevel, i )
    {
        pCache[i] = ABC_ALLOC( double, Vec_IntSize(vLevel) );
        for ( k = 0; k < Vec_IntSize(vLevel); k++ )
            pCache[i][k] = -1.0;
    }
    Value = Abc_GraphCountPaths_rec( 0, 0, vNodes, pCache, pBuffer, vEdges );
    for ( i = 0; i < Vec_WecSize(vNodes); i++ )
        ABC_FREE( pCache[i] );
    ABC_FREE( pCache );
    return Value;
}